

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O1

void __thiscall soul::Type::Type(Type *this,PrimitiveType *t)

{
  Primitive PVar1;
  
  PVar1 = t->type;
  this->category = PVar1 != invalid;
  this->arrayElementCategory = invalid;
  this->isRef = false;
  this->isConstant = false;
  (this->primitiveType).type = PVar1;
  this->boundingSize = 0;
  this->arrayElementBoundingSize = 0;
  (this->structure).object = (Structure *)0x0;
  return;
}

Assistant:

bool PrimitiveType::isValid() const                 { return type != Primitive::invalid; }